

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.c
# Opt level: O0

int consumesInput(Node *node)

{
  int iVar1;
  size_t sVar2;
  Node *local_30;
  Node *n_1;
  Node *n;
  int result;
  Node *node_local;
  
  if (node == (Node *)0x0) {
    node_local._4_4_ = 0;
  }
  else {
    switch(node->type) {
    case 1:
      n._4_4_ = 0;
      if (((node->rule).flags & 2U) == 0) {
        (node->rule).flags = (node->rule).flags | 2;
        n._4_4_ = consumesInput((node->rule).expression);
        (node->rule).flags = (node->rule).flags & 0xfffffffd;
      }
      else {
        fprintf(_stderr,"possible infinite left recursion in rule \'%s\'\n",(node->rule).name);
      }
      node_local._4_4_ = n._4_4_;
      break;
    default:
      fprintf(_stderr,"\nconsumesInput: illegal node type %d\n",(ulong)(uint)node->type);
      exit(1);
    case 3:
      node_local._4_4_ = consumesInput((node->name).rule);
      break;
    case 4:
      node_local._4_4_ = 1;
      break;
    case 5:
    case 6:
      sVar2 = strlen((node->rule).name);
      node_local._4_4_ = (uint)(sVar2 != 0);
      break;
    case 7:
      node_local._4_4_ = 1;
      break;
    case 8:
      node_local._4_4_ = 0;
      break;
    case 9:
      node_local._4_4_ = 0;
      break;
    case 10:
      for (n_1 = (node->name).rule; n_1 != (Node *)0x0; n_1 = (n_1->rule).next) {
        iVar1 = consumesInput(n_1);
        if (iVar1 == 0) {
          return 0;
        }
      }
      node_local._4_4_ = 1;
      break;
    case 0xb:
      for (local_30 = (node->name).rule; local_30 != (Node *)0x0; local_30 = (local_30->rule).next)
      {
        iVar1 = consumesInput(local_30);
        if (iVar1 != 0) {
          return 1;
        }
      }
      node_local._4_4_ = 0;
      break;
    case 0xc:
      node_local._4_4_ = 0;
      break;
    case 0xd:
      node_local._4_4_ = 0;
      break;
    case 0xe:
      node_local._4_4_ = 0;
      break;
    case 0xf:
      node_local._4_4_ = 0;
      break;
    case 0x10:
      node_local._4_4_ = consumesInput((node->name).rule);
    }
  }
  return node_local._4_4_;
}

Assistant:

int consumesInput(Node *node)
{
  if (!node) return 0;

  switch (node->type)
    {
    case Rule:
      {
        int result= 0;
        if (RuleReached & node->rule.flags)
          fprintf(stderr, "possible infinite left recursion in rule '%s'\n", node->rule.name);
        else
          {
            node->rule.flags |= RuleReached;
            result= consumesInput(node->rule.expression);
            node->rule.flags &= ~RuleReached;
          }
        return result;
      }
      break;

    case Dot:           return 1;
    case Name:          return consumesInput(node->name.rule);
    case Character:
    case String:        return strlen(node->string.value) > 0;
    case Class:         return 1;
    case Action:        return 0;
    case Predicate:     return 0;

    case Alternate:
      {
        Node *n;
        for (n= node->alternate.first;  n;  n= n->alternate.next)
          if (!consumesInput(n))
            return 0;
      }
      return 1;

    case Sequence:
      {
        Node *n;
        for (n= node->alternate.first;  n;  n= n->alternate.next)
          if (consumesInput(n))
            return 1;
      }
      return 0;

    case PeekFor:       return 0;
    case PeekNot:       return 0;
    case Query:         return 0;
    case Star:          return 0;
    case Plus:          return consumesInput(node->plus.element);

    default:
      fprintf(stderr, "\nconsumesInput: illegal node type %d\n", node->type);
      exit(1);
    }
  return 0;
}